

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.h
# Opt level: O3

bool __thiscall ASDCP::MXF::ci_comp::operator()(ci_comp *this,string *a,string *b)

{
  pointer pcVar1;
  ulong uVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long *plVar7;
  ulong uVar8;
  long *local_b0;
  ulong local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  uint *local_90;
  ulong local_88;
  uint local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  uint *local_70;
  ulong local_68;
  undefined8 local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  long *local_50;
  ulong local_48;
  long local_40;
  undefined8 uStack_38;
  
  pcVar1 = (a->_M_dataplus)._M_p;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar1,pcVar1 + a->_M_string_length)
  ;
  uVar2 = local_88;
  puVar3 = local_90;
  if (local_88 != 0) {
    uVar8 = 0;
    do {
      iVar4 = tolower((int)*(char *)((long)puVar3 + uVar8));
      *(char *)((long)puVar3 + uVar8) = (char)iVar4;
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  local_70 = local_90;
  if (local_90 == &local_80) {
    uStack_58 = uStack_78;
    uStack_54 = uStack_74;
    local_70 = (uint *)&local_60;
  }
  local_60 = CONCAT44(uStack_7c,local_80);
  local_68 = local_88;
  local_88 = 0;
  local_80 = local_80 & 0xffffff00;
  local_b0 = (long *)&local_a0;
  pcVar1 = (b->_M_dataplus)._M_p;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar1,pcVar1 + b->_M_string_length)
  ;
  uVar2 = local_a8;
  plVar7 = local_b0;
  if (local_a8 != 0) {
    uVar8 = 0;
    do {
      iVar4 = tolower((int)*(char *)((long)plVar7 + uVar8));
      *(char *)((long)plVar7 + uVar8) = (char)iVar4;
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  uVar8 = local_68;
  uVar2 = local_a8;
  plVar7 = local_b0;
  if (local_b0 == (long *)&local_a0) {
    uStack_38 = uStack_98;
    plVar7 = &local_40;
  }
  local_40 = CONCAT71(uStack_9f,local_a0);
  local_48 = local_a8;
  local_a8 = 0;
  local_a0 = 0;
  uVar6 = local_68;
  if (uVar2 < local_68) {
    uVar6 = uVar2;
  }
  local_b0 = (long *)&local_a0;
  local_50 = plVar7;
  if (uVar6 != 0) {
    uVar5 = memcmp(local_70,plVar7,uVar6);
    uVar6 = (ulong)uVar5;
    if (uVar5 != 0) goto LAB_001af67a;
  }
  uVar6 = 0xffffffff80000000;
  if (-0x80000000 < (long)(uVar8 - uVar2)) {
    uVar6 = uVar8 - uVar2;
  }
  if (0x7ffffffe < (long)uVar6) {
    uVar6 = 0;
  }
LAB_001af67a:
  if ((plVar7 != &local_40) && (operator_delete(plVar7,local_40 + 1), local_b0 != (long *)&local_a0)
     ) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  if (local_70 != (uint *)&local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT44(uStack_7c,local_80) + 1);
  }
  return (bool)((byte)(uVar6 >> 0x1f) & 1);
}

Assistant:

inline bool operator()(const std::string& a, const std::string& b) const {
	  return to_lower(a) < to_lower(b);
	}